

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmForEachCommand.cxx
# Opt level: O3

void __thiscall
cmForEachFunctionBlocker::cmForEachFunctionBlocker(cmForEachFunctionBlocker *this,cmMakefile *mf)

{
  (this->super_cmFunctionBlocker).StartingContext.Name._M_dataplus._M_p =
       (pointer)&(this->super_cmFunctionBlocker).StartingContext.Name.field_2;
  (this->super_cmFunctionBlocker).StartingContext.Name._M_string_length = 0;
  (this->super_cmFunctionBlocker).StartingContext.Name.field_2._M_local_buf[0] = '\0';
  (this->super_cmFunctionBlocker).StartingContext.FilePath._M_dataplus._M_p =
       (pointer)&(this->super_cmFunctionBlocker).StartingContext.FilePath.field_2;
  (this->super_cmFunctionBlocker).StartingContext.FilePath._M_string_length = 0;
  (this->super_cmFunctionBlocker).StartingContext.FilePath.field_2._M_local_buf[0] = '\0';
  (this->super_cmFunctionBlocker).StartingContext.Line = 0;
  (this->super_cmFunctionBlocker)._vptr_cmFunctionBlocker =
       (_func_int **)&PTR_IsFunctionBlocked_006d01c0;
  (this->Args).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Args).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Args).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Functions).super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Functions).super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Functions).super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->Makefile = mf;
  this->Depth = 0;
  cmMakefile::PushLoopBlock(mf);
  return;
}

Assistant:

cmForEachFunctionBlocker::cmForEachFunctionBlocker(cmMakefile* mf):
  Makefile(mf), Depth(0)
{
  this->Makefile->PushLoopBlock();
}